

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  float fVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  int iVar56;
  ulong uVar57;
  long lVar58;
  ulong uVar59;
  uint uVar60;
  long lVar61;
  Scene *pSVar62;
  ulong uVar63;
  ulong *puVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  bool bVar68;
  bool bVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar123 [64];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_cd0;
  undefined1 local_ca0 [32];
  Scene *local_c80;
  undefined1 auStack_c78 [24];
  long local_c60;
  undefined1 auStack_c58 [24];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar64 = local_7f8;
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar114 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar118 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar123 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar31 = fVar2 * 0.99999964;
  fVar32 = fVar3 * 0.99999964;
  fVar33 = fVar4 * 0.99999964;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  uVar65 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar67 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar63 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar56 = (tray->tnear).field_0.i[k];
  auVar93 = ZEXT1664(CONCAT412(iVar56,CONCAT48(iVar56,CONCAT44(iVar56,iVar56))));
  local_b40._16_16_ = mm_lookupmask_ps._240_16_;
  local_b40._0_16_ = mm_lookupmask_ps._0_16_;
  iVar56 = (tray->tfar).field_0.i[k];
  auVar99 = ZEXT1664(CONCAT412(iVar56,CONCAT48(iVar56,CONCAT44(iVar56,iVar56))));
  iVar56 = 1 << ((uint)k & 0x1f);
  auVar71._4_4_ = iVar56;
  auVar71._0_4_ = iVar56;
  auVar71._8_4_ = iVar56;
  auVar71._12_4_ = iVar56;
  auVar71._16_4_ = iVar56;
  auVar71._20_4_ = iVar56;
  auVar71._24_4_ = iVar56;
  auVar71._28_4_ = iVar56;
  auVar72 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar71 = vpand_avx2(auVar71,auVar72);
  local_be0 = vpcmpeqd_avx2(auVar71,auVar72);
  bVar69 = true;
  auVar78._8_4_ = 0x3f800000;
  auVar78._0_8_ = 0x3f8000003f800000;
  auVar78._12_4_ = 0x3f800000;
  auVar78._16_4_ = 0x3f800000;
  auVar78._20_4_ = 0x3f800000;
  auVar78._24_4_ = 0x3f800000;
  auVar78._28_4_ = 0x3f800000;
  auVar72._8_4_ = 0xbf800000;
  auVar72._0_8_ = 0xbf800000bf800000;
  auVar72._12_4_ = 0xbf800000;
  auVar72._16_4_ = 0xbf800000;
  auVar72._20_4_ = 0xbf800000;
  auVar72._24_4_ = 0xbf800000;
  auVar72._28_4_ = 0xbf800000;
  auVar71 = vblendvps_avx(auVar78,auVar72,local_b40);
  auVar109 = ZEXT3264(auVar71);
  do {
    uVar66 = puVar64[-1];
    puVar64 = puVar64 + -1;
    auVar88 = auVar93._0_16_;
    auVar94 = auVar99._0_16_;
    auVar110 = auVar114._0_16_;
    auVar115 = auVar118._0_16_;
    auVar120 = auVar123._0_16_;
    while ((uVar66 & 8) == 0) {
      auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + uVar65),auVar110);
      auVar70._0_4_ = fVar31 * auVar34._0_4_;
      auVar70._4_4_ = fVar31 * auVar34._4_4_;
      auVar70._8_4_ = fVar31 * auVar34._8_4_;
      auVar70._12_4_ = fVar31 * auVar34._12_4_;
      auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + uVar67),auVar115);
      auVar75._0_4_ = fVar32 * auVar34._0_4_;
      auVar75._4_4_ = fVar32 * auVar34._4_4_;
      auVar75._8_4_ = fVar32 * auVar34._8_4_;
      auVar75._12_4_ = fVar32 * auVar34._12_4_;
      auVar34 = vmaxps_avx(auVar70,auVar75);
      auVar70 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + uVar63),auVar120);
      auVar76._0_4_ = fVar33 * auVar70._0_4_;
      auVar76._4_4_ = fVar33 * auVar70._4_4_;
      auVar76._8_4_ = fVar33 * auVar70._8_4_;
      auVar76._12_4_ = fVar33 * auVar70._12_4_;
      auVar70 = vmaxps_avx(auVar76,auVar88);
      auVar34 = vmaxps_avx(auVar34,auVar70);
      auVar70 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + (uVar65 ^ 0x10)),auVar110);
      auVar77._0_4_ = fVar2 * auVar70._0_4_;
      auVar77._4_4_ = fVar2 * auVar70._4_4_;
      auVar77._8_4_ = fVar2 * auVar70._8_4_;
      auVar77._12_4_ = fVar2 * auVar70._12_4_;
      auVar70 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + (uVar67 ^ 0x10)),auVar115);
      auVar81._0_4_ = fVar3 * auVar70._0_4_;
      auVar81._4_4_ = fVar3 * auVar70._4_4_;
      auVar81._8_4_ = fVar3 * auVar70._8_4_;
      auVar81._12_4_ = fVar3 * auVar70._12_4_;
      auVar70 = vminps_avx(auVar77,auVar81);
      auVar75 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + (uVar63 ^ 0x10)),auVar120);
      auVar82._0_4_ = fVar4 * auVar75._0_4_;
      auVar82._4_4_ = fVar4 * auVar75._4_4_;
      auVar82._8_4_ = fVar4 * auVar75._8_4_;
      auVar82._12_4_ = fVar4 * auVar75._12_4_;
      auVar75 = vminps_avx(auVar82,auVar94);
      auVar70 = vminps_avx(auVar70,auVar75);
      auVar34 = vcmpps_avx(auVar34,auVar70,2);
      uVar60 = vmovmskps_avx(auVar34);
      if (uVar60 == 0) goto LAB_0057e5fe;
      uVar57 = uVar66 & 0xfffffffffffffff0;
      lVar61 = 0;
      for (uVar66 = (ulong)(byte)uVar60; (uVar66 & 1) == 0;
          uVar66 = uVar66 >> 1 | 0x8000000000000000) {
        lVar61 = lVar61 + 1;
      }
      uVar66 = *(ulong *)(uVar57 + lVar61 * 8);
      uVar60 = (uVar60 & 0xff) - 1 & uVar60 & 0xff;
      uVar59 = (ulong)uVar60;
      if (uVar60 != 0) {
        *puVar64 = uVar66;
        lVar61 = 0;
        for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
          lVar61 = lVar61 + 1;
        }
        uVar60 = uVar60 - 1 & uVar60;
        uVar59 = (ulong)uVar60;
        bVar68 = uVar60 == 0;
        while( true ) {
          puVar64 = puVar64 + 1;
          uVar66 = *(ulong *)(uVar57 + lVar61 * 8);
          if (bVar68) break;
          *puVar64 = uVar66;
          lVar61 = 0;
          for (uVar66 = uVar59; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
            lVar61 = lVar61 + 1;
          }
          uVar59 = uVar59 - 1 & uVar59;
          bVar68 = uVar59 == 0;
        }
      }
    }
    uVar57 = (ulong)((uint)uVar66 & 0xf);
    if (uVar57 != 8) {
      uVar66 = uVar66 & 0xfffffffffffffff0;
      local_c60 = 0;
      local_ca0 = auVar109._0_32_;
      do {
        lVar58 = local_c60 * 0xe0;
        lVar61 = uVar66 + 0xd0 + lVar58;
        local_b20 = *(undefined8 *)(lVar61 + 0x10);
        uStack_b18 = *(undefined8 *)(lVar61 + 0x18);
        lVar61 = uVar66 + 0xc0 + lVar58;
        local_b00 = *(undefined8 *)(lVar61 + 0x10);
        uStack_af8 = *(undefined8 *)(lVar61 + 0x18);
        uStack_af0 = local_b00;
        uStack_ae8 = uStack_af8;
        uStack_b10 = local_b20;
        uStack_b08 = uStack_b18;
        auVar89._16_16_ = *(undefined1 (*) [16])(uVar66 + 0x60 + lVar58);
        auVar89._0_16_ = *(undefined1 (*) [16])(uVar66 + lVar58);
        auVar79._16_16_ = *(undefined1 (*) [16])(uVar66 + 0x70 + lVar58);
        auVar79._0_16_ = *(undefined1 (*) [16])(uVar66 + 0x10 + lVar58);
        auVar108._16_16_ = *(undefined1 (*) [16])(uVar66 + 0x80 + lVar58);
        auVar108._0_16_ = *(undefined1 (*) [16])(uVar66 + 0x20 + lVar58);
        auVar34 = *(undefined1 (*) [16])(uVar66 + 0x30 + lVar58);
        auVar116._16_16_ = auVar34;
        auVar116._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar66 + 0x40 + lVar58);
        auVar95._16_16_ = auVar34;
        auVar95._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar66 + 0x50 + lVar58);
        auVar100._16_16_ = auVar34;
        auVar100._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar66 + 0x90 + lVar58);
        auVar111._16_16_ = auVar34;
        auVar111._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar66 + 0xa0 + lVar58);
        auVar136._16_16_ = auVar34;
        auVar136._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar66 + 0xb0 + lVar58);
        auVar73._16_16_ = auVar34;
        auVar73._0_16_ = auVar34;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar131._4_4_ = uVar1;
        auVar131._0_4_ = uVar1;
        auVar131._8_4_ = uVar1;
        auVar131._12_4_ = uVar1;
        auVar131._16_4_ = uVar1;
        auVar131._20_4_ = uVar1;
        auVar131._24_4_ = uVar1;
        auVar131._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar133._4_4_ = uVar1;
        auVar133._0_4_ = uVar1;
        auVar133._8_4_ = uVar1;
        auVar133._12_4_ = uVar1;
        auVar133._16_4_ = uVar1;
        auVar133._20_4_ = uVar1;
        auVar133._24_4_ = uVar1;
        auVar133._28_4_ = uVar1;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar134._4_4_ = uVar5;
        auVar134._0_4_ = uVar5;
        auVar134._8_4_ = uVar5;
        auVar134._12_4_ = uVar5;
        auVar134._16_4_ = uVar5;
        auVar134._20_4_ = uVar5;
        auVar134._24_4_ = uVar5;
        auVar134._28_4_ = uVar5;
        auVar89 = vsubps_avx(auVar89,auVar131);
        auVar79 = vsubps_avx(auVar79,auVar133);
        local_c20 = vsubps_avx(auVar108,auVar134);
        auVar71 = vsubps_avx(auVar116,auVar131);
        auVar72 = vsubps_avx(auVar95,auVar133);
        auVar78 = vsubps_avx(auVar100,auVar134);
        auVar95 = vsubps_avx(auVar111,auVar131);
        auVar100 = vsubps_avx(auVar136,auVar133);
        auVar35 = vsubps_avx(auVar73,auVar134);
        auVar73 = vsubps_avx(auVar95,auVar89);
        auVar108 = vsubps_avx(auVar100,auVar79);
        auVar111 = vsubps_avx(auVar35,local_c20);
        auVar74._0_4_ = auVar89._0_4_ + auVar95._0_4_;
        auVar74._4_4_ = auVar89._4_4_ + auVar95._4_4_;
        auVar74._8_4_ = auVar89._8_4_ + auVar95._8_4_;
        auVar74._12_4_ = auVar89._12_4_ + auVar95._12_4_;
        auVar74._16_4_ = auVar89._16_4_ + auVar95._16_4_;
        auVar74._20_4_ = auVar89._20_4_ + auVar95._20_4_;
        auVar74._24_4_ = auVar89._24_4_ + auVar95._24_4_;
        auVar74._28_4_ = auVar89._28_4_ + auVar95._28_4_;
        auVar112._0_4_ = auVar100._0_4_ + auVar79._0_4_;
        auVar112._4_4_ = auVar100._4_4_ + auVar79._4_4_;
        auVar112._8_4_ = auVar100._8_4_ + auVar79._8_4_;
        auVar112._12_4_ = auVar100._12_4_ + auVar79._12_4_;
        auVar112._16_4_ = auVar100._16_4_ + auVar79._16_4_;
        auVar112._20_4_ = auVar100._20_4_ + auVar79._20_4_;
        auVar112._24_4_ = auVar100._24_4_ + auVar79._24_4_;
        auVar112._28_4_ = auVar100._28_4_ + auVar79._28_4_;
        fVar9 = local_c20._0_4_;
        auVar96._0_4_ = auVar35._0_4_ + fVar9;
        fVar10 = local_c20._4_4_;
        auVar96._4_4_ = auVar35._4_4_ + fVar10;
        fVar11 = local_c20._8_4_;
        auVar96._8_4_ = auVar35._8_4_ + fVar11;
        fVar12 = local_c20._12_4_;
        auVar96._12_4_ = auVar35._12_4_ + fVar12;
        fVar13 = local_c20._16_4_;
        auVar96._16_4_ = auVar35._16_4_ + fVar13;
        fVar14 = local_c20._20_4_;
        auVar96._20_4_ = auVar35._20_4_ + fVar14;
        fVar15 = local_c20._24_4_;
        auVar96._24_4_ = auVar35._24_4_ + fVar15;
        fVar124 = auVar35._28_4_;
        auVar96._28_4_ = fVar124 + local_c20._28_4_;
        auVar36._4_4_ = auVar111._4_4_ * auVar112._4_4_;
        auVar36._0_4_ = auVar111._0_4_ * auVar112._0_4_;
        auVar36._8_4_ = auVar111._8_4_ * auVar112._8_4_;
        auVar36._12_4_ = auVar111._12_4_ * auVar112._12_4_;
        auVar36._16_4_ = auVar111._16_4_ * auVar112._16_4_;
        auVar36._20_4_ = auVar111._20_4_ * auVar112._20_4_;
        auVar36._24_4_ = auVar111._24_4_ * auVar112._24_4_;
        auVar36._28_4_ = uVar1;
        auVar70 = vfmsub231ps_fma(auVar36,auVar108,auVar96);
        auVar37._4_4_ = auVar73._4_4_ * auVar96._4_4_;
        auVar37._0_4_ = auVar73._0_4_ * auVar96._0_4_;
        auVar37._8_4_ = auVar73._8_4_ * auVar96._8_4_;
        auVar37._12_4_ = auVar73._12_4_ * auVar96._12_4_;
        auVar37._16_4_ = auVar73._16_4_ * auVar96._16_4_;
        auVar37._20_4_ = auVar73._20_4_ * auVar96._20_4_;
        auVar37._24_4_ = auVar73._24_4_ * auVar96._24_4_;
        auVar37._28_4_ = auVar96._28_4_;
        auVar34 = vfmsub231ps_fma(auVar37,auVar111,auVar74);
        auVar40._4_4_ = auVar108._4_4_ * auVar74._4_4_;
        auVar40._0_4_ = auVar108._0_4_ * auVar74._0_4_;
        auVar40._8_4_ = auVar108._8_4_ * auVar74._8_4_;
        auVar40._12_4_ = auVar108._12_4_ * auVar74._12_4_;
        auVar40._16_4_ = auVar108._16_4_ * auVar74._16_4_;
        auVar40._20_4_ = auVar108._20_4_ * auVar74._20_4_;
        auVar40._24_4_ = auVar108._24_4_ * auVar74._24_4_;
        auVar40._28_4_ = auVar74._28_4_;
        auVar75 = vfmsub231ps_fma(auVar40,auVar73,auVar112);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0xa0);
        auVar132._4_4_ = uVar1;
        auVar132._0_4_ = uVar1;
        auVar132._8_4_ = uVar1;
        auVar132._12_4_ = uVar1;
        auVar132._16_4_ = uVar1;
        auVar132._20_4_ = uVar1;
        auVar132._24_4_ = uVar1;
        auVar132._28_4_ = uVar1;
        fVar6 = *(float *)(ray + k * 4 + 0xc0);
        auVar41._4_4_ = fVar6 * auVar75._4_4_;
        auVar41._0_4_ = fVar6 * auVar75._0_4_;
        auVar41._8_4_ = fVar6 * auVar75._8_4_;
        auVar41._12_4_ = fVar6 * auVar75._12_4_;
        auVar41._16_4_ = fVar6 * 0.0;
        auVar41._20_4_ = fVar6 * 0.0;
        auVar41._24_4_ = fVar6 * 0.0;
        auVar41._28_4_ = fVar124;
        auVar34 = vfmadd231ps_fma(auVar41,auVar132,ZEXT1632(auVar34));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar135._4_4_ = uVar1;
        auVar135._0_4_ = uVar1;
        auVar135._8_4_ = uVar1;
        auVar135._12_4_ = uVar1;
        auVar135._16_4_ = uVar1;
        auVar135._20_4_ = uVar1;
        auVar135._24_4_ = uVar1;
        auVar135._28_4_ = uVar1;
        auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar135,ZEXT1632(auVar70));
        auVar36 = vsubps_avx(auVar79,auVar72);
        local_b60 = vsubps_avx(local_c20,auVar78);
        auVar83._0_4_ = auVar72._0_4_ + auVar79._0_4_;
        auVar83._4_4_ = auVar72._4_4_ + auVar79._4_4_;
        auVar83._8_4_ = auVar72._8_4_ + auVar79._8_4_;
        auVar83._12_4_ = auVar72._12_4_ + auVar79._12_4_;
        auVar83._16_4_ = auVar72._16_4_ + auVar79._16_4_;
        auVar83._20_4_ = auVar72._20_4_ + auVar79._20_4_;
        auVar83._24_4_ = auVar72._24_4_ + auVar79._24_4_;
        auVar83._28_4_ = auVar72._28_4_ + auVar79._28_4_;
        auVar97._0_4_ = fVar9 + auVar78._0_4_;
        auVar97._4_4_ = fVar10 + auVar78._4_4_;
        auVar97._8_4_ = fVar11 + auVar78._8_4_;
        auVar97._12_4_ = fVar12 + auVar78._12_4_;
        auVar97._16_4_ = fVar13 + auVar78._16_4_;
        auVar97._20_4_ = fVar14 + auVar78._20_4_;
        auVar97._24_4_ = fVar15 + auVar78._24_4_;
        fVar119 = auVar78._28_4_;
        auVar97._28_4_ = local_c20._28_4_ + fVar119;
        fVar102 = local_b60._0_4_;
        fVar105 = local_b60._4_4_;
        auVar42._4_4_ = auVar83._4_4_ * fVar105;
        auVar42._0_4_ = auVar83._0_4_ * fVar102;
        fVar16 = local_b60._8_4_;
        auVar42._8_4_ = auVar83._8_4_ * fVar16;
        fVar19 = local_b60._12_4_;
        auVar42._12_4_ = auVar83._12_4_ * fVar19;
        fVar22 = local_b60._16_4_;
        auVar42._16_4_ = auVar83._16_4_ * fVar22;
        fVar25 = local_b60._20_4_;
        auVar42._20_4_ = auVar83._20_4_ * fVar25;
        fVar28 = local_b60._24_4_;
        auVar42._24_4_ = auVar83._24_4_ * fVar28;
        auVar42._28_4_ = auVar112._28_4_;
        auVar75 = vfmsub231ps_fma(auVar42,auVar36,auVar97);
        local_b80 = vsubps_avx(auVar89,auVar71);
        fVar103 = local_b80._0_4_;
        fVar106 = local_b80._4_4_;
        auVar43._4_4_ = auVar97._4_4_ * fVar106;
        auVar43._0_4_ = auVar97._0_4_ * fVar103;
        fVar17 = local_b80._8_4_;
        auVar43._8_4_ = auVar97._8_4_ * fVar17;
        fVar20 = local_b80._12_4_;
        auVar43._12_4_ = auVar97._12_4_ * fVar20;
        fVar23 = local_b80._16_4_;
        auVar43._16_4_ = auVar97._16_4_ * fVar23;
        fVar26 = local_b80._20_4_;
        auVar43._20_4_ = auVar97._20_4_ * fVar26;
        fVar29 = local_b80._24_4_;
        auVar43._24_4_ = auVar97._24_4_ * fVar29;
        auVar43._28_4_ = auVar97._28_4_;
        auVar121._0_4_ = auVar89._0_4_ + auVar71._0_4_;
        auVar121._4_4_ = auVar89._4_4_ + auVar71._4_4_;
        auVar121._8_4_ = auVar89._8_4_ + auVar71._8_4_;
        auVar121._12_4_ = auVar89._12_4_ + auVar71._12_4_;
        auVar121._16_4_ = auVar89._16_4_ + auVar71._16_4_;
        auVar121._20_4_ = auVar89._20_4_ + auVar71._20_4_;
        auVar121._24_4_ = auVar89._24_4_ + auVar71._24_4_;
        auVar121._28_4_ = auVar89._28_4_ + auVar71._28_4_;
        auVar70 = vfmsub231ps_fma(auVar43,local_b60,auVar121);
        fVar104 = auVar36._0_4_;
        fVar107 = auVar36._4_4_;
        auVar44._4_4_ = auVar121._4_4_ * fVar107;
        auVar44._0_4_ = auVar121._0_4_ * fVar104;
        fVar18 = auVar36._8_4_;
        auVar44._8_4_ = auVar121._8_4_ * fVar18;
        fVar21 = auVar36._12_4_;
        auVar44._12_4_ = auVar121._12_4_ * fVar21;
        fVar24 = auVar36._16_4_;
        auVar44._16_4_ = auVar121._16_4_ * fVar24;
        fVar27 = auVar36._20_4_;
        auVar44._20_4_ = auVar121._20_4_ * fVar27;
        fVar30 = auVar36._24_4_;
        auVar44._24_4_ = auVar121._24_4_ * fVar30;
        auVar44._28_4_ = auVar121._28_4_;
        auVar76 = vfmsub231ps_fma(auVar44,local_b80,auVar83);
        auVar122._0_4_ = auVar76._0_4_ * fVar6;
        auVar122._4_4_ = auVar76._4_4_ * fVar6;
        auVar122._8_4_ = auVar76._8_4_ * fVar6;
        auVar122._12_4_ = auVar76._12_4_ * fVar6;
        auVar122._16_4_ = fVar6 * 0.0;
        auVar122._20_4_ = fVar6 * 0.0;
        auVar122._24_4_ = fVar6 * 0.0;
        auVar122._28_4_ = 0;
        auVar70 = vfmadd231ps_fma(auVar122,auVar132,ZEXT1632(auVar70));
        auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar135,ZEXT1632(auVar75));
        auVar37 = vsubps_avx(auVar71,auVar95);
        auVar90._0_4_ = auVar71._0_4_ + auVar95._0_4_;
        auVar90._4_4_ = auVar71._4_4_ + auVar95._4_4_;
        auVar90._8_4_ = auVar71._8_4_ + auVar95._8_4_;
        auVar90._12_4_ = auVar71._12_4_ + auVar95._12_4_;
        auVar90._16_4_ = auVar71._16_4_ + auVar95._16_4_;
        auVar90._20_4_ = auVar71._20_4_ + auVar95._20_4_;
        auVar90._24_4_ = auVar71._24_4_ + auVar95._24_4_;
        auVar90._28_4_ = auVar71._28_4_ + auVar95._28_4_;
        auVar95 = vsubps_avx(auVar72,auVar100);
        auVar101._0_4_ = auVar72._0_4_ + auVar100._0_4_;
        auVar101._4_4_ = auVar72._4_4_ + auVar100._4_4_;
        auVar101._8_4_ = auVar72._8_4_ + auVar100._8_4_;
        auVar101._12_4_ = auVar72._12_4_ + auVar100._12_4_;
        auVar101._16_4_ = auVar72._16_4_ + auVar100._16_4_;
        auVar101._20_4_ = auVar72._20_4_ + auVar100._20_4_;
        auVar101._24_4_ = auVar72._24_4_ + auVar100._24_4_;
        auVar101._28_4_ = auVar72._28_4_ + auVar100._28_4_;
        auVar100 = vsubps_avx(auVar78,auVar35);
        auVar84._0_4_ = auVar78._0_4_ + auVar35._0_4_;
        auVar84._4_4_ = auVar78._4_4_ + auVar35._4_4_;
        auVar84._8_4_ = auVar78._8_4_ + auVar35._8_4_;
        auVar84._12_4_ = auVar78._12_4_ + auVar35._12_4_;
        auVar84._16_4_ = auVar78._16_4_ + auVar35._16_4_;
        auVar84._20_4_ = auVar78._20_4_ + auVar35._20_4_;
        auVar84._24_4_ = auVar78._24_4_ + auVar35._24_4_;
        auVar84._28_4_ = fVar119 + fVar124;
        auVar35._4_4_ = auVar100._4_4_ * auVar101._4_4_;
        auVar35._0_4_ = auVar100._0_4_ * auVar101._0_4_;
        auVar35._8_4_ = auVar100._8_4_ * auVar101._8_4_;
        auVar35._12_4_ = auVar100._12_4_ * auVar101._12_4_;
        auVar35._16_4_ = auVar100._16_4_ * auVar101._16_4_;
        auVar35._20_4_ = auVar100._20_4_ * auVar101._20_4_;
        auVar35._24_4_ = auVar100._24_4_ * auVar101._24_4_;
        auVar35._28_4_ = fVar119;
        auVar76 = vfmsub231ps_fma(auVar35,auVar95,auVar84);
        auVar45._4_4_ = auVar84._4_4_ * auVar37._4_4_;
        auVar45._0_4_ = auVar84._0_4_ * auVar37._0_4_;
        auVar45._8_4_ = auVar84._8_4_ * auVar37._8_4_;
        auVar45._12_4_ = auVar84._12_4_ * auVar37._12_4_;
        auVar45._16_4_ = auVar84._16_4_ * auVar37._16_4_;
        auVar45._20_4_ = auVar84._20_4_ * auVar37._20_4_;
        auVar45._24_4_ = auVar84._24_4_ * auVar37._24_4_;
        auVar45._28_4_ = auVar84._28_4_;
        auVar75 = vfmsub231ps_fma(auVar45,auVar100,auVar90);
        auVar46._4_4_ = auVar95._4_4_ * auVar90._4_4_;
        auVar46._0_4_ = auVar95._0_4_ * auVar90._0_4_;
        auVar46._8_4_ = auVar95._8_4_ * auVar90._8_4_;
        auVar46._12_4_ = auVar95._12_4_ * auVar90._12_4_;
        auVar46._16_4_ = auVar95._16_4_ * auVar90._16_4_;
        auVar46._20_4_ = auVar95._20_4_ * auVar90._20_4_;
        auVar46._24_4_ = auVar95._24_4_ * auVar90._24_4_;
        auVar46._28_4_ = auVar90._28_4_;
        auVar77 = vfmsub231ps_fma(auVar46,auVar37,auVar101);
        auVar91._0_4_ = fVar6 * auVar77._0_4_;
        auVar91._4_4_ = fVar6 * auVar77._4_4_;
        auVar91._8_4_ = fVar6 * auVar77._8_4_;
        auVar91._12_4_ = fVar6 * auVar77._12_4_;
        auVar91._16_4_ = fVar6 * 0.0;
        auVar91._20_4_ = fVar6 * 0.0;
        auVar91._24_4_ = fVar6 * 0.0;
        auVar91._28_4_ = 0;
        auVar75 = vfmadd231ps_fma(auVar91,auVar132,ZEXT1632(auVar75));
        auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar135,ZEXT1632(auVar76));
        local_ac0 = ZEXT1632(auVar70);
        local_ae0 = auVar34._0_4_;
        fStack_adc = auVar34._4_4_;
        fStack_ad8 = auVar34._8_4_;
        fStack_ad4 = auVar34._12_4_;
        local_aa0 = ZEXT1632(CONCAT412(auVar75._12_4_ + auVar70._12_4_ + fStack_ad4,
                                       CONCAT48(auVar75._8_4_ + auVar70._8_4_ + fStack_ad8,
                                                CONCAT44(auVar75._4_4_ + auVar70._4_4_ + fStack_adc,
                                                         auVar75._0_4_ + auVar70._0_4_ + local_ae0))
                                      ));
        auVar85._8_4_ = 0x7fffffff;
        auVar85._0_8_ = 0x7fffffff7fffffff;
        auVar85._12_4_ = 0x7fffffff;
        auVar85._16_4_ = 0x7fffffff;
        auVar85._20_4_ = 0x7fffffff;
        auVar85._24_4_ = 0x7fffffff;
        auVar85._28_4_ = 0x7fffffff;
        auVar71 = vminps_avx(ZEXT1632(auVar34),local_ac0);
        auVar71 = vminps_avx(auVar71,ZEXT1632(auVar75));
        local_bc0 = vandps_avx(local_aa0,auVar85);
        fVar119 = local_bc0._0_4_ * 1.1920929e-07;
        fVar124 = local_bc0._4_4_ * 1.1920929e-07;
        auVar47._4_4_ = fVar124;
        auVar47._0_4_ = fVar119;
        fVar125 = local_bc0._8_4_ * 1.1920929e-07;
        auVar47._8_4_ = fVar125;
        fVar126 = local_bc0._12_4_ * 1.1920929e-07;
        auVar47._12_4_ = fVar126;
        fVar127 = local_bc0._16_4_ * 1.1920929e-07;
        auVar47._16_4_ = fVar127;
        fVar128 = local_bc0._20_4_ * 1.1920929e-07;
        auVar47._20_4_ = fVar128;
        fVar129 = local_bc0._24_4_ * 1.1920929e-07;
        auVar47._24_4_ = fVar129;
        auVar47._28_4_ = 0x34000000;
        auVar113._0_8_ = CONCAT44(fVar124,fVar119) ^ 0x8000000080000000;
        auVar113._8_4_ = -fVar125;
        auVar113._12_4_ = -fVar126;
        auVar113._16_4_ = -fVar127;
        auVar113._20_4_ = -fVar128;
        auVar113._24_4_ = -fVar129;
        auVar113._28_4_ = 0xb4000000;
        auVar71 = vcmpps_avx(auVar71,auVar113,5);
        local_ba0 = ZEXT1632(auVar34);
        auVar78 = vmaxps_avx(local_ba0,local_ac0);
        auVar72 = vmaxps_avx(auVar78,ZEXT1632(auVar75));
        auVar72 = vcmpps_avx(auVar72,auVar47,2);
        auVar72 = vorps_avx(auVar71,auVar72);
        if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar72 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar72 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar72 >> 0x7f,0) == '\0') &&
              (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar72 >> 0xbf,0) == '\0') &&
            (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar72[0x1f]) {
LAB_0057e58f:
          auVar109 = ZEXT3264(local_ca0);
        }
        else {
          auVar48._4_4_ = fVar107 * auVar111._4_4_;
          auVar48._0_4_ = fVar104 * auVar111._0_4_;
          auVar48._8_4_ = fVar18 * auVar111._8_4_;
          auVar48._12_4_ = fVar21 * auVar111._12_4_;
          auVar48._16_4_ = fVar24 * auVar111._16_4_;
          auVar48._20_4_ = fVar27 * auVar111._20_4_;
          auVar48._24_4_ = fVar30 * auVar111._24_4_;
          auVar48._28_4_ = auVar71._28_4_;
          auVar49._4_4_ = fVar106 * auVar108._4_4_;
          auVar49._0_4_ = fVar103 * auVar108._0_4_;
          auVar49._8_4_ = fVar17 * auVar108._8_4_;
          auVar49._12_4_ = fVar20 * auVar108._12_4_;
          auVar49._16_4_ = fVar23 * auVar108._16_4_;
          auVar49._20_4_ = fVar26 * auVar108._20_4_;
          auVar49._24_4_ = fVar29 * auVar108._24_4_;
          auVar49._28_4_ = 0x34000000;
          auVar34 = vfmsub213ps_fma(auVar108,local_b60,auVar48);
          auVar50._4_4_ = auVar95._4_4_ * fVar105;
          auVar50._0_4_ = auVar95._0_4_ * fVar102;
          auVar50._8_4_ = auVar95._8_4_ * fVar16;
          auVar50._12_4_ = auVar95._12_4_ * fVar19;
          auVar50._16_4_ = auVar95._16_4_ * fVar22;
          auVar50._20_4_ = auVar95._20_4_ * fVar25;
          auVar50._24_4_ = auVar95._24_4_ * fVar28;
          auVar50._28_4_ = auVar78._28_4_;
          auVar51._4_4_ = fVar106 * auVar100._4_4_;
          auVar51._0_4_ = fVar103 * auVar100._0_4_;
          auVar51._8_4_ = fVar17 * auVar100._8_4_;
          auVar51._12_4_ = fVar20 * auVar100._12_4_;
          auVar51._16_4_ = fVar23 * auVar100._16_4_;
          auVar51._20_4_ = fVar26 * auVar100._20_4_;
          auVar51._24_4_ = fVar29 * auVar100._24_4_;
          auVar51._28_4_ = local_bc0._28_4_;
          auVar75 = vfmsub213ps_fma(auVar100,auVar36,auVar50);
          auVar71 = vandps_avx(auVar48,auVar85);
          auVar78 = vandps_avx(auVar50,auVar85);
          auVar71 = vcmpps_avx(auVar71,auVar78,1);
          local_a80 = vblendvps_avx(ZEXT1632(auVar75),ZEXT1632(auVar34),auVar71);
          auVar52._4_4_ = fVar107 * auVar37._4_4_;
          auVar52._0_4_ = fVar104 * auVar37._0_4_;
          auVar52._8_4_ = fVar18 * auVar37._8_4_;
          auVar52._12_4_ = fVar21 * auVar37._12_4_;
          auVar52._16_4_ = fVar24 * auVar37._16_4_;
          auVar52._20_4_ = fVar27 * auVar37._20_4_;
          auVar52._24_4_ = fVar30 * auVar37._24_4_;
          auVar52._28_4_ = auVar71._28_4_;
          auVar34 = vfmsub213ps_fma(auVar37,local_b60,auVar51);
          auVar53._4_4_ = auVar73._4_4_ * fVar105;
          auVar53._0_4_ = auVar73._0_4_ * fVar102;
          auVar53._8_4_ = auVar73._8_4_ * fVar16;
          auVar53._12_4_ = auVar73._12_4_ * fVar19;
          auVar53._16_4_ = auVar73._16_4_ * fVar22;
          auVar53._20_4_ = auVar73._20_4_ * fVar25;
          auVar53._24_4_ = auVar73._24_4_ * fVar28;
          auVar53._28_4_ = auVar78._28_4_;
          auVar75 = vfmsub213ps_fma(auVar111,local_b80,auVar53);
          auVar71 = vandps_avx(auVar53,auVar85);
          auVar78 = vandps_avx(auVar51,auVar85);
          auVar71 = vcmpps_avx(auVar71,auVar78,1);
          local_a60 = vblendvps_avx(ZEXT1632(auVar34),ZEXT1632(auVar75),auVar71);
          auVar34 = vfmsub213ps_fma(auVar73,auVar36,auVar49);
          auVar75 = vfmsub213ps_fma(auVar95,local_b80,auVar52);
          auVar71 = vandps_avx(auVar49,auVar85);
          auVar78 = vandps_avx(auVar52,auVar85);
          auVar71 = vcmpps_avx(auVar71,auVar78,1);
          local_a40 = vblendvps_avx(ZEXT1632(auVar75),ZEXT1632(auVar34),auVar71);
          auVar34 = vpackssdw_avx(auVar72._0_16_,auVar72._16_16_);
          fVar119 = local_a40._0_4_;
          auVar86._0_4_ = fVar119 * fVar6;
          fVar102 = local_a40._4_4_;
          auVar86._4_4_ = fVar102 * fVar6;
          fVar103 = local_a40._8_4_;
          auVar86._8_4_ = fVar103 * fVar6;
          fVar104 = local_a40._12_4_;
          auVar86._12_4_ = fVar104 * fVar6;
          fVar105 = local_a40._16_4_;
          auVar86._16_4_ = fVar105 * fVar6;
          fVar106 = local_a40._20_4_;
          auVar86._20_4_ = fVar106 * fVar6;
          fVar107 = local_a40._24_4_;
          auVar86._24_4_ = fVar107 * fVar6;
          auVar86._28_4_ = 0;
          auVar75 = vfmadd213ps_fma(auVar132,local_a60,auVar86);
          auVar75 = vfmadd213ps_fma(auVar135,local_a80,ZEXT1632(auVar75));
          auVar78 = ZEXT1632(CONCAT412(auVar75._12_4_ + auVar75._12_4_,
                                       CONCAT48(auVar75._8_4_ + auVar75._8_4_,
                                                CONCAT44(auVar75._4_4_ + auVar75._4_4_,
                                                         auVar75._0_4_ + auVar75._0_4_))));
          auVar54._4_4_ = fVar102 * fVar10;
          auVar54._0_4_ = fVar119 * fVar9;
          auVar54._8_4_ = fVar103 * fVar11;
          auVar54._12_4_ = fVar104 * fVar12;
          auVar54._16_4_ = fVar105 * fVar13;
          auVar54._20_4_ = fVar106 * fVar14;
          auVar54._24_4_ = fVar107 * fVar15;
          auVar54._28_4_ = auVar72._28_4_;
          auVar75 = vfmadd213ps_fma(auVar79,local_a60,auVar54);
          auVar76 = vfmadd213ps_fma(auVar89,local_a80,ZEXT1632(auVar75));
          auVar71 = vrcpps_avx(auVar78);
          auVar130._8_4_ = 0x3f800000;
          auVar130._0_8_ = 0x3f8000003f800000;
          auVar130._12_4_ = 0x3f800000;
          auVar130._16_4_ = 0x3f800000;
          auVar130._20_4_ = 0x3f800000;
          auVar130._24_4_ = 0x3f800000;
          auVar130._28_4_ = 0x3f800000;
          auVar75 = vfnmadd213ps_fma(auVar71,auVar78,auVar130);
          auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar71,auVar71);
          local_9c0 = ZEXT1632(CONCAT412(auVar75._12_4_ * (auVar76._12_4_ + auVar76._12_4_),
                                         CONCAT48(auVar75._8_4_ * (auVar76._8_4_ + auVar76._8_4_),
                                                  CONCAT44(auVar75._4_4_ *
                                                           (auVar76._4_4_ + auVar76._4_4_),
                                                           auVar75._0_4_ *
                                                           (auVar76._0_4_ + auVar76._0_4_)))));
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar117._4_4_ = uVar1;
          auVar117._0_4_ = uVar1;
          auVar117._8_4_ = uVar1;
          auVar117._12_4_ = uVar1;
          auVar117._16_4_ = uVar1;
          auVar117._20_4_ = uVar1;
          auVar117._24_4_ = uVar1;
          auVar117._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          local_c40._4_4_ = uVar1;
          local_c40._0_4_ = uVar1;
          local_c40._8_4_ = uVar1;
          local_c40._12_4_ = uVar1;
          local_c40._16_4_ = uVar1;
          local_c40._20_4_ = uVar1;
          local_c40._24_4_ = uVar1;
          local_c40._28_4_ = uVar1;
          auVar71 = vcmpps_avx(auVar117,local_9c0,2);
          auVar72 = vcmpps_avx(local_9c0,local_c40,2);
          auVar71 = vandps_avx(auVar71,auVar72);
          auVar75 = vpackssdw_avx(auVar71._0_16_,auVar71._16_16_);
          auVar34 = vpand_avx(auVar75,auVar34);
          auVar71 = vpmovsxwd_avx2(auVar34);
          if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar71 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar71 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar71 >> 0x7f,0) == '\0') &&
                (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar71 >> 0xbf,0) == '\0') &&
              (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar71[0x1f]) goto LAB_0057e58f;
          auVar71 = vcmpps_avx(auVar78,_DAT_01faff00,4);
          auVar75 = vpackssdw_avx(auVar71._0_16_,auVar71._16_16_);
          auVar34 = vpand_avx(auVar34,auVar75);
          local_a20 = vpmovsxwd_avx2(auVar34);
          if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_a20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_a20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_a20 >> 0x7f,0) == '\0') &&
                (local_a20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_a20 >> 0xbf,0) == '\0') &&
              (local_a20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_a20[0x1f]) goto LAB_0057e58f;
          auStack_c58 = auVar111._8_24_;
          uStack_ad0 = 0;
          uStack_acc = 0;
          uStack_ac8 = 0;
          uStack_ac4 = 0;
          local_940 = local_b40;
          auVar71 = vrcpps_avx(local_aa0);
          auVar98._8_4_ = 0x3f800000;
          auVar98._0_8_ = 0x3f8000003f800000;
          auVar98._12_4_ = 0x3f800000;
          auVar98._16_4_ = 0x3f800000;
          auVar98._20_4_ = 0x3f800000;
          auVar98._24_4_ = 0x3f800000;
          auVar98._28_4_ = 0x3f800000;
          auVar75 = vfnmadd213ps_fma(local_aa0,auVar71,auVar98);
          auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar71,auVar71);
          auVar92._8_4_ = 0x219392ef;
          auVar92._0_8_ = 0x219392ef219392ef;
          auVar92._12_4_ = 0x219392ef;
          auVar92._16_4_ = 0x219392ef;
          auVar92._20_4_ = 0x219392ef;
          auVar92._24_4_ = 0x219392ef;
          auVar92._28_4_ = 0x219392ef;
          auVar71 = vcmpps_avx(local_bc0,auVar92,5);
          auVar71 = vandps_avx(auVar71,ZEXT1632(auVar75));
          auVar55._4_4_ = fStack_adc * auVar71._4_4_;
          auVar55._0_4_ = local_ae0 * auVar71._0_4_;
          auVar55._8_4_ = fStack_ad8 * auVar71._8_4_;
          auVar55._12_4_ = fStack_ad4 * auVar71._12_4_;
          auVar55._16_4_ = auVar71._16_4_ * 0.0;
          auVar55._20_4_ = auVar71._20_4_ * 0.0;
          auVar55._24_4_ = auVar71._24_4_ * 0.0;
          auVar55._28_4_ = 0;
          auVar72 = vminps_avx(auVar55,auVar98);
          auVar80._0_4_ = auVar70._0_4_ * auVar71._0_4_;
          auVar80._4_4_ = auVar70._4_4_ * auVar71._4_4_;
          auVar80._8_4_ = auVar70._8_4_ * auVar71._8_4_;
          auVar80._12_4_ = auVar70._12_4_ * auVar71._12_4_;
          auVar80._16_4_ = auVar71._16_4_ * 0.0;
          auVar80._20_4_ = auVar71._20_4_ * 0.0;
          auVar80._24_4_ = auVar71._24_4_ * 0.0;
          auVar80._28_4_ = 0;
          auVar71 = vminps_avx(auVar80,auVar98);
          auVar78 = vsubps_avx(auVar98,auVar72);
          auVar79 = vsubps_avx(auVar98,auVar71);
          local_9e0 = vblendvps_avx(auVar71,auVar78,local_b40);
          local_a00 = vblendvps_avx(auVar72,auVar79,local_b40);
          auVar109 = ZEXT3264(local_ca0);
          fVar6 = local_ca0._0_4_;
          fVar9 = local_ca0._4_4_;
          fVar10 = local_ca0._8_4_;
          fVar11 = local_ca0._12_4_;
          fVar12 = local_ca0._16_4_;
          fVar13 = local_ca0._20_4_;
          fVar14 = local_ca0._24_4_;
          local_980._4_4_ = fVar9 * local_a60._4_4_;
          local_980._0_4_ = fVar6 * local_a60._0_4_;
          local_980._8_4_ = fVar10 * local_a60._8_4_;
          local_980._12_4_ = fVar11 * local_a60._12_4_;
          local_980._16_4_ = fVar12 * local_a60._16_4_;
          local_980._20_4_ = fVar13 * local_a60._20_4_;
          local_980._24_4_ = fVar14 * local_a60._24_4_;
          local_980._28_4_ = local_9e0._28_4_;
          local_9a0[0] = local_a80._0_4_ * fVar6;
          local_9a0[1] = local_a80._4_4_ * fVar9;
          local_9a0[2] = local_a80._8_4_ * fVar10;
          local_9a0[3] = local_a80._12_4_ * fVar11;
          fStack_990 = local_a80._16_4_ * fVar12;
          fStack_98c = local_a80._20_4_ * fVar13;
          fStack_988 = local_a80._24_4_ * fVar14;
          uStack_984 = local_a00._28_4_;
          local_960[0] = fVar6 * fVar119;
          local_960[1] = fVar9 * fVar102;
          local_960[2] = fVar10 * fVar103;
          local_960[3] = fVar11 * fVar104;
          fStack_950 = fVar12 * fVar105;
          fStack_94c = fVar13 * fVar106;
          fStack_948 = fVar14 * fVar107;
          uStack_944 = auVar78._28_4_;
          auVar34 = vpacksswb_avx(auVar34,auVar34);
          uVar59 = (ulong)(byte)(SUB161(auVar34 >> 7,0) & 1 | (SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar34 >> 0x3f,0) << 7);
          auStack_c78 = auVar89._8_24_;
          local_c80 = context->scene;
          pSVar62 = context->scene;
          do {
            uVar38 = 0;
            for (uVar39 = uVar59; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
              uVar38 = uVar38 + 1;
            }
            uVar60 = *(uint *)((long)&local_b00 + uVar38 * 4);
            pGVar7 = (pSVar62->geometries).items[uVar60].ptr;
            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              uVar59 = uVar59 ^ 1L << (uVar38 & 0x3f);
            }
            else {
              local_c20._0_8_ = uVar59;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0057e614:
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                return bVar69;
              }
              uVar59 = (ulong)(uint)((int)uVar38 * 4);
              local_8c0 = *(undefined4 *)(local_a00 + uVar59);
              local_8a0 = *(undefined4 *)(local_9e0 + uVar59);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9c0 + uVar59);
              local_cd0.context = context->user;
              local_880 = *(undefined4 *)((long)&local_b20 + uVar59);
              local_920 = *(undefined4 *)((long)local_9a0 + uVar59);
              uVar1 = *(undefined4 *)(local_980 + uVar59);
              local_900._4_4_ = uVar1;
              local_900._0_4_ = uVar1;
              local_900._8_4_ = uVar1;
              local_900._12_4_ = uVar1;
              local_900._16_4_ = uVar1;
              local_900._20_4_ = uVar1;
              local_900._24_4_ = uVar1;
              local_900._28_4_ = uVar1;
              local_8e0 = *(undefined4 *)((long)local_960 + uVar59);
              local_860._4_4_ = uVar60;
              local_860._0_4_ = uVar60;
              local_860._8_4_ = uVar60;
              local_860._12_4_ = uVar60;
              local_860._16_4_ = uVar60;
              local_860._20_4_ = uVar60;
              local_860._24_4_ = uVar60;
              local_860._28_4_ = uVar60;
              uStack_91c = local_920;
              uStack_918 = local_920;
              uStack_914 = local_920;
              uStack_910 = local_920;
              uStack_90c = local_920;
              uStack_908 = local_920;
              uStack_904 = local_920;
              uStack_8dc = local_8e0;
              uStack_8d8 = local_8e0;
              uStack_8d4 = local_8e0;
              uStack_8d0 = local_8e0;
              uStack_8cc = local_8e0;
              uStack_8c8 = local_8e0;
              uStack_8c4 = local_8e0;
              uStack_8bc = local_8c0;
              uStack_8b8 = local_8c0;
              uStack_8b4 = local_8c0;
              uStack_8b0 = local_8c0;
              uStack_8ac = local_8c0;
              uStack_8a8 = local_8c0;
              uStack_8a4 = local_8c0;
              uStack_89c = local_8a0;
              uStack_898 = local_8a0;
              uStack_894 = local_8a0;
              uStack_890 = local_8a0;
              uStack_88c = local_8a0;
              uStack_888 = local_8a0;
              uStack_884 = local_8a0;
              uStack_87c = local_880;
              uStack_878 = local_880;
              uStack_874 = local_880;
              uStack_870 = local_880;
              uStack_86c = local_880;
              uStack_868 = local_880;
              uStack_864 = local_880;
              auVar71 = vpcmpeqd_avx2(local_860,local_860);
              uStack_83c = (local_cd0.context)->instID[0];
              local_840 = uStack_83c;
              uStack_838 = uStack_83c;
              uStack_834 = uStack_83c;
              uStack_830 = uStack_83c;
              uStack_82c = uStack_83c;
              uStack_828 = uStack_83c;
              uStack_824 = uStack_83c;
              uStack_81c = (local_cd0.context)->instPrimID[0];
              local_820 = uStack_81c;
              uStack_818 = uStack_81c;
              uStack_814 = uStack_81c;
              uStack_810 = uStack_81c;
              uStack_80c = uStack_81c;
              uStack_808 = uStack_81c;
              uStack_804 = uStack_81c;
              local_c00 = local_be0;
              local_cd0.valid = (int *)local_c00;
              local_cd0.geometryUserPtr = pGVar7->userPtr;
              local_cd0.hit = (RTCHitN *)&local_920;
              local_cd0.N = 8;
              local_cd0.ray = (RTCRayN *)ray;
              if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar71 = ZEXT1632(auVar71._0_16_);
                (*pGVar7->occlusionFilterN)(&local_cd0);
                auVar71 = vpcmpeqd_avx2(auVar71,auVar71);
              }
              auVar78 = vpcmpeqd_avx2(local_c00,_DAT_01faff00);
              auVar72 = auVar71 & ~auVar78;
              if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar72 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar72 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar72 >> 0x7f,0) == '\0') &&
                    (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar72 >> 0xbf,0) == '\0') &&
                  (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar72[0x1f]) {
                auVar78 = auVar78 ^ auVar71;
              }
              else {
                p_Var8 = context->args->filter;
                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar71 = ZEXT1632(auVar71._0_16_);
                  (*p_Var8)(&local_cd0);
                  auVar71 = vpcmpeqd_avx2(auVar71,auVar71);
                }
                auVar72 = vpcmpeqd_avx2(local_c00,_DAT_01faff00);
                auVar78 = auVar72 ^ auVar71;
                auVar87._8_4_ = 0xff800000;
                auVar87._0_8_ = 0xff800000ff800000;
                auVar87._12_4_ = 0xff800000;
                auVar87._16_4_ = 0xff800000;
                auVar87._20_4_ = 0xff800000;
                auVar87._24_4_ = 0xff800000;
                auVar87._28_4_ = 0xff800000;
                auVar71 = vblendvps_avx(auVar87,*(undefined1 (*) [32])(local_cd0.ray + 0x100),
                                        auVar72);
                *(undefined1 (*) [32])(local_cd0.ray + 0x100) = auVar71;
              }
              auVar109 = ZEXT3264(local_ca0);
              if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar78 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar78 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar78 >> 0x7f,0) != '\0') ||
                    (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar78 >> 0xbf,0) != '\0') ||
                  (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar78[0x1f] < '\0') goto LAB_0057e614;
              *(int *)(ray + k * 4 + 0x100) = local_c40._0_4_;
              uVar59 = local_c20._0_8_ ^ 1L << (uVar38 & 0x3f);
            }
            pSVar62 = local_c80;
          } while (uVar59 != 0);
        }
        auVar123 = ZEXT1664(auVar120);
        auVar118 = ZEXT1664(auVar115);
        auVar114 = ZEXT1664(auVar110);
        auVar99 = ZEXT1664(auVar94);
        auVar93 = ZEXT1664(auVar88);
        local_c60 = local_c60 + 1;
      } while (local_c60 != uVar57 - 8);
    }
LAB_0057e5fe:
    bVar69 = puVar64 != &local_800;
    if (!bVar69) {
      return bVar69;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }